

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O3

SC_Lib * Abc_SclReadFromStr(Vec_Str_t *vOut)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  Vec_Int_t *pVVar7;
  undefined8 uVar8;
  char **ppVarNames;
  word *pwVar9;
  long lVar10;
  int *piVar11;
  Vec_Str_t *vOut_00;
  undefined8 *puVar12;
  uint uVar13;
  float fVar14;
  SC_Lib *pSVar15;
  size_t sVar16;
  char *pcVar17;
  void **ppvVar18;
  void *pvVar19;
  Vec_Int_t *pVVar20;
  uint *__ptr;
  Vec_Wrd_t *pVVar21;
  void *pvVar22;
  byte bVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  float fVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  char *pcVar34;
  uint uVar35;
  uint uVar36;
  int iVar37;
  ulong uVar38;
  char *pcVar39;
  char *pcVar40;
  ulong uVar41;
  int iVar42;
  long lVar43;
  uint uVar44;
  undefined8 *puVar45;
  uint local_8c;
  Vec_Str_t *local_88;
  char *local_80;
  undefined8 *local_78;
  SC_Lib *local_70;
  undefined8 local_68;
  uint local_5c;
  undefined8 local_58;
  undefined8 *local_50;
  long local_48;
  ulong local_40;
  uint local_38;
  uint local_34;
  
  pSVar15 = (SC_Lib *)calloc(1,0x90);
  pSVar15->default_max_out_slew = -1.0;
  pSVar15->unit_time = 9;
  pSVar15->unit_cap_fst = 1.0;
  pSVar15->unit_cap_snd = 0xc;
  local_8c = 1;
  uVar13 = vOut->nSize;
  uVar29 = local_8c;
  pcVar17 = local_80;
  if (0 < (int)uVar13) {
    pcVar40 = vOut->pArray;
    bVar23 = 0;
    uVar41 = 0;
    pcVar39 = (char *)0x0;
    do {
      bVar1 = pcVar40[uVar41 & 0xffffffff];
      iVar25 = (int)uVar41;
      if (-1 < (char)bVar1) {
        if (((uint)bVar1 << (bVar23 & 0x1f) | (uint)pcVar39) != 8) {
          Abc_Print((int)vOut,pcVar39);
          return (SC_Lib *)0x0;
        }
        if (uVar13 <= iVar25 + 1U) goto LAB_0043d9dd;
        lVar43 = 0;
        goto LAB_0043bc65;
      }
      pcVar39 = (char *)(ulong)((uint)pcVar39 | (bVar1 & 0x7f) << (bVar23 & 0x1f));
      local_8c = iVar25 + 2;
      uVar41 = uVar41 + 1;
      bVar23 = bVar23 + 7;
      uVar29 = local_8c;
    } while (uVar13 != uVar41);
  }
  goto LAB_0043c9cd;
  while( true ) {
    bVar1 = pcVar40[iVar25 + 2U];
    if (-1 < (char)bVar1) {
      local_70->unit_cap_snd = (uint)bVar1 << (bVar23 & 0x1f) | uVar24;
      uVar24 = iVar25 + 4;
      uVar35 = iVar25 + 3;
      uVar29 = uVar24;
      if (-1 < (int)uVar35) {
        if ((int)uVar13 <= (int)uVar35) {
          uVar13 = uVar35;
        }
        bVar23 = 0;
        uVar28 = 0;
        local_8c = uVar24;
        goto LAB_0043bf6a;
      }
      break;
    }
    uVar24 = uVar24 | (bVar1 & 0x7f) << (bVar23 & 0x1f);
    local_8c = iVar25 + 4;
    uVar38 = (ulong)(iVar25 + 1);
    bVar23 = bVar23 + 7;
    uVar29 = local_8c;
    if ((int)(uVar35 + 3) < 0) break;
LAB_0043bf09:
    iVar25 = (int)uVar38;
    uVar29 = local_8c;
    if ((int)uVar13 <= (int)(iVar25 + 2U)) break;
  }
  goto LAB_0043c9cd;
  while( true ) {
    bVar1 = pcVar40[uVar35];
    if (-1 < (char)bVar1) {
      uVar35 = uVar35 + 1;
      uVar28 = (uint)bVar1 << (bVar23 & 0x1f) | uVar28;
      if (uVar28 == 0) {
        pcVar40 = (char *)(ulong)uVar35;
        goto LAB_0043c44f;
      }
      local_40 = CONCAT44(local_40._4_4_,uVar28);
      puVar45 = (undefined8 *)0x0;
      uVar13 = 0;
      goto LAB_0043bfb8;
    }
    uVar28 = uVar28 | (bVar1 & 0x7f) << (bVar23 & 0x1f);
    local_8c = uVar35 + 2;
    uVar35 = uVar35 + 1;
    bVar23 = bVar23 + 7;
    uVar38 = (ulong)((int)uVar38 + 1);
    uVar29 = local_8c;
    if ((int)uVar24 < 0) break;
LAB_0043bf6a:
    uVar29 = local_8c;
    if ((int)uVar38 - uVar13 == -3) break;
  }
  goto LAB_0043c9cd;
  while( true ) {
    pcVar39 = local_88->pArray;
    uVar41 = (ulong)uVar35;
    lVar43 = 0;
    pcVar40 = pcVar39;
    uVar29 = uVar35 + 9;
    do {
      uVar28 = uVar29;
      local_8c = uVar35 + (int)lVar43 + 1;
      uVar29 = local_8c;
      pcVar17 = local_80;
      if ((int)uVar24 <= (int)(uVar35 + (int)lVar43)) goto LAB_0043c9cd;
      lVar43 = lVar43 + 1;
      pcVar17 = pcVar40 + uVar41;
      pcVar40 = pcVar40 + 1;
      uVar29 = uVar28 + 1;
    } while (*pcVar17 != '\0');
    local_68 = (Vec_Int_t *)(pcVar39 + uVar41);
    local_5c = uVar13 + 1;
    sVar16 = strlen((char *)local_68);
    pcVar17 = (char *)malloc(sVar16 + 1);
    strcpy(pcVar17,(char *)local_68);
    *(char **)local_80 = pcVar17;
    iVar25 = (int)lVar43;
    uVar13 = uVar35 + iVar25;
    uVar26 = uVar41 + lVar43 + 1;
    uVar36 = (uint)uVar26;
    uVar29 = uVar36;
    pcVar17 = local_80;
    if (((int)uVar13 < 0) || ((int)uVar24 <= (int)uVar13)) goto LAB_0043c9cd;
    uVar38 = uVar41 + lVar43 + 2;
    uVar32 = (uint)uVar38;
    uVar29 = uVar32;
    if (uVar24 <= uVar36) goto LAB_0043c9cd;
    uVar31 = uVar41 + lVar43 + 3;
    uVar36 = (uint)uVar31;
    uVar29 = uVar36;
    if (uVar24 <= uVar32) goto LAB_0043c9cd;
    uVar27 = uVar41 + lVar43 + 4;
    uVar32 = (uint)uVar27;
    uVar29 = uVar32;
    if (uVar24 <= uVar36) goto LAB_0043c9cd;
    *(uint *)(local_80 + 8) =
         CONCAT13(pcVar39[uVar31 & 0xffffffff],
                  CONCAT12(pcVar39[uVar38 & 0xffffffff],
                           CONCAT11(pcVar39[uVar26 & 0xffffffff],pcVar39[uVar13 & 0x7fffffff])));
    uVar26 = uVar41 + lVar43 + 5;
    uVar13 = (uint)uVar26;
    uVar29 = uVar13;
    if (uVar24 <= uVar32) goto LAB_0043c9cd;
    uVar38 = uVar41 + lVar43 + 6;
    uVar36 = (uint)uVar38;
    uVar29 = uVar36;
    if (uVar24 <= uVar13) goto LAB_0043c9cd;
    uVar41 = uVar41 + lVar43 + 7;
    uVar13 = (uint)uVar41;
    uVar29 = uVar13;
    if (uVar24 <= uVar36) goto LAB_0043c9cd;
    uVar29 = uVar35 + iVar25 + 8;
    if (uVar24 <= uVar13) goto LAB_0043c9cd;
    *(uint *)(local_80 + 0xc) =
         CONCAT13(pcVar39[uVar41 & 0xffffffff],
                  CONCAT12(pcVar39[uVar38 & 0xffffffff],
                           CONCAT11(pcVar39[uVar26 & 0xffffffff],pcVar39[uVar27 & 0xffffffff])));
    uVar35 = uVar35 + iVar25 + 9;
    bVar23 = 0;
    uVar13 = 0;
    local_8c = uVar35;
    while( true ) {
      uVar29 = local_8c;
      if ((int)uVar24 <= (int)uVar28) goto LAB_0043c9cd;
      bVar1 = pcVar39[uVar28];
      if (-1 < (char)bVar1) break;
      uVar13 = uVar13 | (bVar1 & 0x7f) << (bVar23 & 0x1f);
      local_8c = uVar28 + 2;
      uVar28 = uVar28 + 1;
      bVar23 = bVar23 + 7;
      uVar29 = local_8c;
      if ((int)uVar35 < 0) goto LAB_0043c9cd;
    }
    pcVar40 = (char *)(ulong)(uVar28 + 1);
    uVar13 = (uint)bVar1 << (bVar23 & 0x1f) | uVar13;
    if (uVar13 != 0) {
      local_68 = (Vec_Int_t *)(local_80 + 0x10);
      do {
        iVar25 = (int)pcVar40;
        uVar24 = iVar25 + 1;
        uVar29 = uVar24;
        pcVar17 = local_80;
        if (iVar25 < 0) goto LAB_0043c9cd;
        uVar41 = (ulong)pcVar40 & 0xffffffff;
        bVar23 = 0;
        lVar43 = 0;
        uVar35 = 0;
        local_8c = uVar24;
        while( true ) {
          uVar29 = local_8c;
          if (local_88->nSize <= (int)(uVar41 + lVar43)) goto LAB_0043c9cd;
          bVar1 = local_88->pArray[uVar41 + lVar43 & 0xffffffff];
          iVar42 = (int)lVar43;
          if (-1 < (char)bVar1) break;
          uVar35 = uVar35 | (bVar1 & 0x7f) << (bVar23 & 0x1f);
          local_8c = iVar25 + iVar42 + 2;
          lVar43 = lVar43 + 1;
          bVar23 = bVar23 + 7;
          uVar29 = local_8c;
          if ((int)uVar24 < 0) goto LAB_0043c9cd;
        }
        Vec_IntPush(local_68,(uint)bVar1 << (bVar23 & 0x1f) | uVar35);
        uVar26 = uVar41 + lVar43 + 2;
        uVar35 = (uint)uVar26;
        iVar25 = iVar25 + iVar42 + 1;
        uVar29 = uVar35;
        pcVar17 = local_80;
        if ((iVar25 < 0) || (uVar28 = local_88->nSize, (int)uVar28 <= iVar25)) goto LAB_0043c9cd;
        pcVar39 = local_88->pArray;
        uVar24 = (uint)(byte)pcVar39[uVar24 + iVar42 & 0x7fffffff];
        uVar38 = uVar41 + lVar43 + 3;
        uVar36 = (uint)uVar38;
        uVar29 = uVar36;
        if (uVar28 <= uVar35) goto LAB_0043c9cd;
        bVar23 = pcVar39[uVar26 & 0xffffffff];
        uVar26 = uVar41 + lVar43 + 4;
        uVar35 = (uint)uVar26;
        uVar29 = uVar35;
        if (uVar28 <= uVar36) goto LAB_0043c9cd;
        bVar1 = pcVar39[uVar38 & 0xffffffff];
        pcVar34 = (char *)(uVar41 + lVar43 + 5);
        local_8c = (uint)pcVar34;
        uVar29 = local_8c;
        local_58 = pcVar40;
        if (uVar28 <= uVar35) goto LAB_0043c9cd;
        uVar35 = (uint)(byte)pcVar39[uVar26 & 0xffffffff];
        uVar29 = *(uint *)(local_80 + 0x24);
        if (uVar29 == *(uint *)(local_80 + 0x20)) {
          local_48 = CONCAT44(local_48._4_4_,(uint)(byte)pcVar39[uVar26 & 0xffffffff]);
          if ((int)uVar29 < 0x10) {
            if (*(void **)(local_80 + 0x28) == (void *)0x0) {
              pvVar19 = malloc(0x40);
            }
            else {
              pvVar19 = realloc(*(void **)(local_80 + 0x28),0x40);
            }
            *(void **)(local_80 + 0x28) = pvVar19;
            local_80[0x20] = '\x10';
            local_80[0x21] = '\0';
            local_80[0x22] = '\0';
            local_80[0x23] = '\0';
          }
          else {
            local_78 = (undefined8 *)CONCAT44(local_78._4_4_,uVar24);
            if (*(void **)(local_80 + 0x28) == (void *)0x0) {
              pvVar19 = malloc((ulong)uVar29 * 8);
            }
            else {
              pvVar19 = realloc(*(void **)(local_80 + 0x28),(ulong)uVar29 * 8);
            }
            *(void **)(local_80 + 0x28) = pvVar19;
            *(uint *)(local_80 + 0x20) = uVar29 * 2;
            uVar24 = (uint)local_78;
          }
          uVar35 = (uint)local_48;
        }
        else {
          pvVar19 = *(void **)(local_80 + 0x28);
        }
        iVar25 = *(int *)(local_80 + 0x24);
        *(int *)(local_80 + 0x24) = iVar25 + 1;
        *(uint *)((long)pvVar19 + (long)iVar25 * 4) =
             uVar35 << 0x18 | (uint)bVar1 << 0x10 | (uint)bVar23 << 8 | uVar24;
        uVar13 = uVar13 - 1;
        pcVar40 = pcVar34;
      } while (uVar13 != 0);
      pcVar40 = (char *)(ulong)((int)local_58 + iVar42 + 5);
    }
    uVar35 = (uint)pcVar40;
    iVar25 = (int)local_40 + -1;
    local_40 = CONCAT44(local_40._4_4_,iVar25);
    puVar45 = local_50;
    uVar13 = local_5c;
    if (iVar25 == 0) break;
LAB_0043bfb8:
    local_80 = (char *)calloc(1,0x30);
    uVar29 = (uint)puVar45;
    if (uVar13 == uVar29) {
      if ((int)uVar29 < 0x10) {
        ppvVar18 = (local_70->vWireLoads).pArray;
        if (ppvVar18 == (void **)0x0) {
          ppvVar18 = (void **)malloc(0x80);
        }
        else {
          ppvVar18 = (void **)realloc(ppvVar18,0x80);
        }
        (local_70->vWireLoads).pArray = ppvVar18;
        (local_70->vWireLoads).nCap = 0x10;
        puVar45 = (undefined8 *)&DAT_00000010;
      }
      else {
        puVar45 = (undefined8 *)(ulong)(uVar29 * 2);
        ppvVar18 = (local_70->vWireLoads).pArray;
        if (ppvVar18 == (void **)0x0) {
          ppvVar18 = (void **)malloc((long)puVar45 * 8);
        }
        else {
          ppvVar18 = (void **)realloc(ppvVar18,(long)puVar45 * 8);
        }
        (local_70->vWireLoads).pArray = ppvVar18;
        (local_70->vWireLoads).nCap = uVar29 * 2;
      }
    }
    else {
      ppvVar18 = (local_70->vWireLoads).pArray;
    }
    (local_70->vWireLoads).nSize = uVar13 + 1;
    ppvVar18[uVar13] = local_80;
    local_50 = puVar45;
    if (((int)uVar35 < 0) || (uVar24 = local_88->nSize, (int)uVar24 <= (int)uVar35))
    goto LAB_0043d9dd;
  }
LAB_0043c44f:
  iVar25 = (int)pcVar40;
  uVar13 = iVar25 + 1;
  uVar29 = uVar13;
  pcVar17 = local_80;
  if (-1 < iVar25) {
    iVar42 = local_88->nSize;
    if (local_88->nSize < iVar25) {
      iVar42 = iVar25;
    }
    bVar23 = 0;
    uVar24 = 0;
    local_8c = uVar13;
    do {
      iVar25 = (int)pcVar40;
      uVar29 = local_8c;
      if (iVar42 == iVar25) break;
      bVar1 = local_88->pArray[(long)pcVar40];
      if (-1 < (char)bVar1) {
        uVar13 = iVar25 + 1;
        uVar24 = (uint)bVar1 << (bVar23 & 0x1f) | uVar24;
        if (uVar24 == 0) goto LAB_0043c97c;
        local_78 = (undefined8 *)0x0;
        uVar35 = 0;
        local_5c = uVar24;
        goto LAB_0043c4bb;
      }
      uVar24 = uVar24 | (bVar1 & 0x7f) << (bVar23 & 0x1f);
      local_8c = iVar25 + 2;
      pcVar40 = (char *)(ulong)(iVar25 + 1);
      bVar23 = bVar23 + 7;
      uVar29 = local_8c;
    } while (-1 < (int)uVar13);
  }
  goto LAB_0043c9cd;
LAB_0043ca03:
  local_34 = uVar36;
  puVar45 = (undefined8 *)calloc(1,0x70);
  *(uint *)(puVar45 + 1) = uVar13;
  uVar29 = (uint)local_40;
  if (uVar13 == uVar29) {
    if ((int)uVar29 < 0x10) {
      ppvVar18 = (local_70->vCells).pArray;
      if (ppvVar18 == (void **)0x0) {
        ppvVar18 = (void **)malloc(0x80);
      }
      else {
        ppvVar18 = (void **)realloc(ppvVar18,0x80);
      }
      (local_70->vCells).pArray = ppvVar18;
      (local_70->vCells).nCap = 0x10;
      uVar41 = 0x10;
    }
    else {
      uVar29 = uVar29 * 2;
      ppvVar18 = (local_70->vCells).pArray;
      sVar16 = (ulong)uVar29 * 8;
      if (ppvVar18 == (void **)0x0) {
        ppvVar18 = (void **)malloc(sVar16);
      }
      else {
        ppvVar18 = (void **)realloc(ppvVar18,sVar16);
      }
      (local_70->vCells).pArray = ppvVar18;
      (local_70->vCells).nCap = uVar29;
      uVar41 = (ulong)uVar29;
    }
  }
  else {
    ppvVar18 = (local_70->vCells).pArray;
    uVar41 = local_40;
  }
  uVar24 = local_8c;
  (local_70->vCells).nSize = uVar13 + 1;
  ppvVar18[uVar13] = puVar45;
  uVar26 = (ulong)local_8c;
  local_78 = puVar45;
  if (((int)local_8c < 0) || (iVar25 = local_88->nSize, iVar25 <= (int)local_8c)) goto LAB_0043d9dd;
  pcVar39 = local_88->pArray;
  lVar43 = 0;
  pcVar40 = pcVar39;
  uVar35 = local_8c + 9;
  uVar28 = local_8c + 0xb;
  uVar36 = local_8c + 0xc;
  do {
    uVar33 = uVar36;
    uVar32 = uVar28;
    uVar44 = uVar35;
    uVar29 = (int)lVar43 + local_8c + 1;
    pcVar17 = local_80;
    if (iVar25 <= (int)((int)lVar43 + local_8c)) goto LAB_0043c9cd;
    lVar43 = lVar43 + 1;
    pcVar17 = pcVar40 + uVar26;
    pcVar40 = pcVar40 + 1;
    uVar35 = uVar44 + 1;
    uVar28 = uVar32 + 1;
    uVar36 = uVar33 + 1;
  } while (*pcVar17 != '\0');
  local_68 = (Vec_Int_t *)(pcVar39 + uVar26);
  local_80 = (char *)CONCAT44(local_80._4_4_,iVar25);
  local_8c = uVar29;
  local_58 = pcVar39;
  local_40 = uVar41;
  local_38 = uVar13 + 1;
  sVar16 = strlen((char *)local_68);
  pcVar17 = (char *)malloc(sVar16 + 1);
  strcpy(pcVar17,(char *)local_68);
  *local_78 = pcVar17;
  iVar25 = (int)lVar43;
  uVar13 = iVar25 + uVar24;
  uVar41 = lVar43 + uVar26 + 1;
  uVar35 = (uint)uVar41;
  uVar29 = uVar35;
  pcVar17 = local_80;
  if (((int)uVar13 < 0) || ((int)(uint)local_80 <= (int)uVar13)) goto LAB_0043c9cd;
  uVar38 = lVar43 + uVar26 + 2;
  uVar28 = (uint)uVar38;
  uVar29 = uVar28;
  if ((uint)local_80 <= uVar35) goto LAB_0043c9cd;
  uVar31 = lVar43 + uVar26 + 3;
  uVar35 = (uint)uVar31;
  uVar29 = uVar35;
  if ((uint)local_80 <= uVar28) goto LAB_0043c9cd;
  uVar27 = lVar43 + uVar26 + 4;
  uVar28 = (uint)uVar27;
  uVar29 = uVar28;
  if ((uint)local_80 <= uVar35) goto LAB_0043c9cd;
  fVar14 = (float)CONCAT13(local_58[uVar31 & 0xffffffff],
                           CONCAT12(local_58[uVar38 & 0xffffffff],
                                    CONCAT11(local_58[uVar41 & 0xffffffff],
                                             local_58[uVar13 & 0x7fffffff])));
  *(float *)(local_78 + 3) = fVar14;
  uVar41 = lVar43 + uVar26 + 5;
  uVar13 = (uint)uVar41;
  uVar29 = uVar13;
  if ((uint)local_80 <= uVar28) goto LAB_0043c9cd;
  uVar38 = lVar43 + uVar26 + 6;
  uVar35 = (uint)uVar38;
  uVar29 = uVar35;
  if ((uint)local_80 <= uVar13) goto LAB_0043c9cd;
  uVar26 = lVar43 + uVar26 + 7;
  uVar13 = (uint)uVar26;
  uVar29 = uVar13;
  if ((uint)local_80 <= uVar35) goto LAB_0043c9cd;
  uVar29 = iVar25 + uVar24 + 8;
  if ((uint)local_80 <= uVar13) goto LAB_0043c9cd;
  fVar30 = (float)CONCAT13(local_58[uVar26 & 0xffffffff],
                           CONCAT12(local_58[uVar38 & 0xffffffff],
                                    CONCAT11(local_58[uVar41 & 0xffffffff],
                                             local_58[uVar27 & 0xffffffff])));
  *(float *)((long)local_78 + 0x1c) = fVar30;
  uVar13 = iVar25 + uVar24 + 9;
  bVar23 = 0;
  uVar24 = 0;
  local_8c = uVar13;
  while( true ) {
    uVar29 = local_8c;
    if ((int)(uint)local_80 <= (int)uVar44) goto LAB_0043c9cd;
    bVar1 = local_58[uVar44];
    if (-1 < (char)bVar1) break;
    uVar24 = uVar24 | (bVar1 & 0x7f) << (bVar23 & 0x1f);
    local_8c = uVar44 + 2;
    uVar44 = uVar44 + 1;
    bVar23 = bVar23 + 7;
    uVar32 = uVar32 + 1;
    uVar33 = uVar33 + 1;
    uVar29 = local_8c;
    if ((int)uVar13 < 0) goto LAB_0043c9cd;
  }
  *(uint *)(local_78 + 5) = (uint)bVar1 << (bVar23 & 0x1f) | uVar24;
  uVar13 = uVar44 + 2;
  uVar29 = uVar13;
  if ((int)(uVar44 + 1) < 0) goto LAB_0043c9cd;
  bVar23 = 0;
  uVar24 = 0;
  local_8c = uVar13;
  while( true ) {
    uVar29 = local_8c;
    if ((int)(uint)local_80 <= (int)(uVar32 - 1)) goto LAB_0043c9cd;
    bVar1 = local_58[uVar32 - 1];
    if (-1 < (char)bVar1) break;
    uVar24 = uVar24 | (bVar1 & 0x7f) << (bVar23 & 0x1f);
    uVar32 = uVar32 + 1;
    bVar23 = bVar23 + 7;
    uVar33 = uVar33 + 1;
    uVar29 = uVar32;
    local_8c = uVar32;
    if ((int)uVar13 < 0) goto LAB_0043c9cd;
  }
  uVar24 = (uint)bVar1 << (bVar23 & 0x1f) | uVar24;
  *(uint *)(local_78 + 8) = uVar24;
  uVar13 = uVar32 + 1;
  uVar29 = uVar13;
  if ((int)uVar32 < 0) goto LAB_0043c9cd;
  bVar23 = 0;
  uVar35 = 0;
  local_8c = uVar13;
  while( true ) {
    uVar41 = (ulong)uVar33;
    uVar29 = local_8c;
    if ((int)(uint)local_80 <= (int)(uVar33 - 1)) goto LAB_0043c9cd;
    bVar1 = local_58[uVar33 - 1];
    if (-1 < (char)bVar1) break;
    uVar35 = uVar35 | (bVar1 & 0x7f) << (bVar23 & 0x1f);
    uVar33 = uVar33 + 1;
    bVar23 = bVar23 + 7;
    uVar29 = uVar33;
    local_8c = uVar33;
    if ((int)uVar13 < 0) goto LAB_0043c9cd;
  }
  uVar35 = (uint)bVar1 << (bVar23 & 0x1f) | uVar35;
  *(uint *)((long)local_78 + 0x44) = uVar35;
  local_78[4] = CONCAT44((int)(fVar30 * 1000.0),(int)(fVar14 * 1000.0));
  if (0 < (int)uVar24) {
    iVar42 = 0;
    pcVar40 = (char *)(ulong)*(uint *)(local_78 + 6);
    iVar25 = *(int *)((long)local_78 + 0x34);
    do {
      puVar45 = (undefined8 *)calloc(1,0x50);
      *(undefined4 *)((long)puVar45 + 0x24) = 0xbf800000;
      iVar37 = (int)pcVar40;
      if (iVar25 == iVar37) {
        if (iVar37 < 0x10) {
          if ((void *)local_78[7] == (void *)0x0) {
            pvVar19 = malloc(0x80);
          }
          else {
            pvVar19 = realloc((void *)local_78[7],0x80);
          }
          local_78[7] = pvVar19;
          *(undefined4 *)(local_78 + 6) = 0x10;
          pcVar40 = &DAT_00000010;
        }
        else {
          pcVar40 = (char *)(ulong)(uint)(iVar37 * 2);
          if ((void *)local_78[7] == (void *)0x0) {
            pvVar19 = malloc((long)pcVar40 * 8);
          }
          else {
            pvVar19 = realloc((void *)local_78[7],(long)pcVar40 * 8);
          }
          local_78[7] = pvVar19;
          *(int *)(local_78 + 6) = iVar37 * 2;
        }
      }
      else {
        pvVar19 = (void *)local_78[7];
      }
      iVar25 = *(int *)((long)local_78 + 0x34);
      iVar37 = iVar25 + 1;
      local_80 = (char *)CONCAT44(local_80._4_4_,iVar37);
      *(int *)((long)local_78 + 0x34) = iVar37;
      *(undefined8 **)((long)pvVar19 + (long)iVar25 * 8) = puVar45;
      *(undefined4 *)(puVar45 + 1) = 1;
      iVar25 = (int)uVar41;
      if ((iVar25 < 0) || (uVar13 = local_88->nSize, (int)uVar13 <= iVar25)) goto LAB_0043d9dd;
      pVVar7 = (Vec_Int_t *)local_88->pArray;
      uVar41 = uVar41 & 0xffffffff;
      lVar43 = 0;
      pVVar20 = pVVar7;
      do {
        local_8c = (int)lVar43 + iVar25 + 1;
        uVar29 = local_8c;
        pcVar17 = local_80;
        if ((int)uVar13 <= (int)lVar43 + iVar25) goto LAB_0043c9cd;
        lVar43 = lVar43 + 1;
        piVar11 = &pVVar20->nCap;
        pVVar20 = (Vec_Int_t *)((long)&pVVar20->nCap + 1);
      } while (*(char *)((long)piVar11 + uVar41) != '\0');
      local_48 = CONCAT44(local_48._4_4_,iVar42);
      pcVar17 = (char *)((long)&pVVar7->nCap + uVar41);
      local_68 = pVVar7;
      local_58 = pcVar40;
      sVar16 = strlen(pcVar17);
      pcVar40 = (char *)malloc(sVar16 + 1);
      strcpy(pcVar40,pcVar17);
      *puVar45 = pcVar40;
      uVar24 = (int)lVar43 + iVar25;
      uVar26 = lVar43 + uVar41 + 1;
      uVar35 = (uint)uVar26;
      uVar29 = uVar35;
      pcVar17 = local_80;
      if (((int)uVar24 < 0) || ((int)uVar13 <= (int)uVar24)) goto LAB_0043c9cd;
      uVar38 = lVar43 + uVar41 + 2;
      uVar28 = (uint)uVar38;
      uVar29 = uVar28;
      if (uVar13 <= uVar35) goto LAB_0043c9cd;
      uVar31 = lVar43 + uVar41 + 3;
      uVar35 = (uint)uVar31;
      uVar29 = uVar35;
      if (uVar13 <= uVar28) goto LAB_0043c9cd;
      uVar27 = lVar43 + uVar41 + 4;
      uVar28 = (uint)uVar27;
      uVar29 = uVar28;
      if (uVar13 <= uVar35) goto LAB_0043c9cd;
      fVar14 = (float)CONCAT13(*(char *)((long)&local_68->nCap + (uVar31 & 0xffffffff)),
                               CONCAT12(*(char *)((long)&local_68->nCap + (uVar38 & 0xffffffff)),
                                        CONCAT11(*(char *)((long)&local_68->nCap +
                                                          (uVar26 & 0xffffffff)),
                                                 *(char *)((long)&local_68->nCap +
                                                          (ulong)(uVar24 & 0x7fffffff)))));
      *(float *)(puVar45 + 2) = fVar14;
      uVar26 = lVar43 + uVar41 + 5;
      uVar24 = (uint)uVar26;
      uVar29 = uVar24;
      if (uVar13 <= uVar28) goto LAB_0043c9cd;
      uVar38 = lVar43 + uVar41 + 6;
      uVar35 = (uint)uVar38;
      uVar29 = uVar35;
      if (uVar13 <= uVar24) goto LAB_0043c9cd;
      uVar31 = lVar43 + uVar41 + 7;
      uVar24 = (uint)uVar31;
      uVar29 = uVar24;
      if (uVar13 <= uVar35) goto LAB_0043c9cd;
      uVar41 = uVar41 + lVar43 + 8;
      local_8c = (uint)uVar41;
      uVar29 = local_8c;
      if (uVar13 <= uVar24) goto LAB_0043c9cd;
      fVar30 = (float)CONCAT13(*(char *)((long)&local_68->nCap + (uVar31 & 0xffffffff)),
                               CONCAT12(*(char *)((long)&local_68->nCap + (uVar38 & 0xffffffff)),
                                        CONCAT11(*(char *)((long)&local_68->nCap +
                                                          (uVar26 & 0xffffffff)),
                                                 *(char *)((long)&local_68->nCap +
                                                          (uVar27 & 0xffffffff)))));
      *(float *)((long)puVar45 + 0x14) = fVar30;
      puVar45[3] = CONCAT44((int)(fVar30 * 1000.0),(int)(fVar14 * 1000.0));
      iVar42 = (uint)local_48 + 1;
      pcVar40 = local_58;
      iVar25 = (uint)local_80;
    } while (iVar42 < *(int *)(local_78 + 8));
    uVar35 = *(uint *)((long)local_78 + 0x44);
  }
  if (0 < (int)uVar35) {
    uVar13 = 0;
    do {
      puVar45 = local_78;
      local_5c = uVar13;
      local_50 = (undefined8 *)calloc(1,0x50);
      *(undefined4 *)((long)local_50 + 0x24) = 0xbf800000;
      uVar13 = *(uint *)((long)puVar45 + 0x34);
      if (uVar13 == *(uint *)(puVar45 + 6)) {
        if ((int)uVar13 < 0x10) {
          if ((void *)puVar45[7] == (void *)0x0) {
            pvVar19 = malloc(0x80);
          }
          else {
            pvVar19 = realloc((void *)puVar45[7],0x80);
          }
          puVar45[7] = pvVar19;
          *(undefined4 *)(puVar45 + 6) = 0x10;
        }
        else {
          if ((void *)puVar45[7] == (void *)0x0) {
            pvVar19 = malloc((ulong)uVar13 << 4);
          }
          else {
            pvVar19 = realloc((void *)puVar45[7],(ulong)uVar13 << 4);
          }
          puVar45[7] = pvVar19;
          *(uint *)(puVar45 + 6) = uVar13 * 2;
        }
      }
      else {
        pvVar19 = (void *)puVar45[7];
      }
      uVar13 = local_8c;
      iVar25 = *(int *)((long)puVar45 + 0x34);
      *(int *)((long)puVar45 + 0x34) = iVar25 + 1;
      *(undefined8 **)((long)pvVar19 + (long)iVar25 * 8) = local_50;
      *(undefined4 *)(local_50 + 1) = 2;
      uVar41 = (ulong)local_8c;
      if (((int)local_8c < 0) || (uVar24 = local_88->nSize, (int)uVar24 <= (int)local_8c))
      goto LAB_0043d9dd;
      pcVar39 = local_88->pArray;
      lVar43 = 0;
      pcVar40 = pcVar39;
      uVar35 = local_8c + 9;
      do {
        uVar28 = uVar35;
        uVar29 = local_8c + (int)lVar43 + 1;
        pcVar17 = local_80;
        if ((int)uVar24 <= (int)(local_8c + (int)lVar43)) goto LAB_0043c9cd;
        lVar43 = lVar43 + 1;
        pcVar17 = pcVar40 + uVar41;
        pcVar40 = pcVar40 + 1;
        uVar35 = uVar28 + 1;
      } while (*pcVar17 != '\0');
      local_8c = uVar29;
      sVar16 = strlen(pcVar39 + uVar41);
      local_80 = (char *)malloc(sVar16 + 1);
      puVar45 = local_50;
      strcpy(local_80,pcVar39 + uVar41);
      *puVar45 = local_80;
      uVar35 = uVar13 + (int)lVar43;
      uVar26 = uVar41 + lVar43 + 1;
      uVar36 = (uint)uVar26;
      uVar29 = uVar36;
      pcVar17 = local_80;
      if (((int)uVar35 < 0) || ((int)uVar24 <= (int)uVar35)) goto LAB_0043c9cd;
      uVar38 = uVar41 + lVar43 + 2;
      uVar32 = (uint)uVar38;
      uVar29 = uVar32;
      if (uVar24 <= uVar36) goto LAB_0043c9cd;
      uVar31 = uVar41 + lVar43 + 3;
      uVar36 = (uint)uVar31;
      uVar29 = uVar36;
      if (uVar24 <= uVar32) goto LAB_0043c9cd;
      uVar27 = uVar41 + lVar43 + 4;
      uVar32 = (uint)uVar27;
      uVar29 = uVar32;
      if (uVar24 <= uVar36) goto LAB_0043c9cd;
      *(uint *)(puVar45 + 4) =
           CONCAT13(pcVar39[uVar31 & 0xffffffff],
                    CONCAT12(pcVar39[uVar38 & 0xffffffff],
                             CONCAT11(pcVar39[uVar26 & 0xffffffff],pcVar39[uVar35 & 0x7fffffff])));
      uVar26 = uVar41 + lVar43 + 5;
      uVar35 = (uint)uVar26;
      uVar29 = uVar35;
      if (uVar24 <= uVar32) goto LAB_0043c9cd;
      uVar38 = uVar41 + lVar43 + 6;
      uVar36 = (uint)uVar38;
      uVar29 = uVar36;
      if (uVar24 <= uVar35) goto LAB_0043c9cd;
      uVar31 = uVar41 + lVar43 + 7;
      uVar35 = (uint)uVar31;
      uVar29 = uVar35;
      if (uVar24 <= uVar36) goto LAB_0043c9cd;
      uVar29 = uVar13 + (int)lVar43 + 8;
      if (uVar24 <= uVar35) goto LAB_0043c9cd;
      *(uint *)((long)puVar45 + 0x24) =
           CONCAT13(pcVar39[uVar31 & 0xffffffff],
                    CONCAT12(pcVar39[uVar38 & 0xffffffff],
                             CONCAT11(pcVar39[uVar26 & 0xffffffff],pcVar39[uVar27 & 0xffffffff])));
      uVar41 = uVar41 + lVar43 + 9;
      uVar35 = (uint)uVar41;
      uVar41 = uVar41 & 0xffffffff;
      bVar23 = 0;
      uVar13 = 0;
      local_8c = uVar35;
      while( true ) {
        uVar29 = local_8c;
        if ((int)uVar24 <= (int)uVar28) goto LAB_0043c9cd;
        bVar1 = pcVar39[uVar28];
        if (-1 < (char)bVar1) break;
        uVar13 = uVar13 | (bVar1 & 0x7f) << (bVar23 & 0x1f);
        uVar41 = uVar41 + 1;
        local_8c = uVar28 + 2;
        uVar28 = uVar28 + 1;
        bVar23 = bVar23 + 7;
        uVar29 = local_8c;
        if ((int)uVar35 < 0) goto LAB_0043c9cd;
      }
      uVar13 = (uint)bVar1 << (bVar23 & 0x1f) | uVar13;
      uVar26 = (ulong)uVar13;
      if (uVar13 != *(uint *)(local_78 + 8)) {
        __assert_fail("k == pCell->n_inputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                      ,0x14f,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
      }
      if (puVar45[5] != 0) {
        __assert_fail("pPin->func_text == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                      ,0x154,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
      }
      if (((int)(uVar28 + 1) < 0) || ((int)uVar24 <= (int)(uVar28 + 1))) goto LAB_0043d9dd;
      uVar38 = (ulong)((uint)uVar41 & 0x7fffffff);
      uVar41 = uVar38;
      do {
        local_8c = (int)uVar41 + 1;
        uVar29 = local_8c;
        if ((int)uVar24 <= (int)uVar41) goto LAB_0043c9cd;
        uVar31 = uVar41 + 1;
        pcVar40 = pcVar39 + uVar41;
        uVar41 = uVar31;
      } while (*pcVar40 != '\0');
      sVar16 = strlen(pcVar39 + uVar38);
      pcVar17 = (char *)malloc(sVar16 + 1);
      strcpy(pcVar17,pcVar39 + uVar38);
      puVar45[5] = pcVar17;
      if (*pcVar17 == '\0') {
        free(pcVar17);
        puVar45[5] = 0;
        if (*(int *)((long)puVar45 + 0x34) != 0) {
          __assert_fail("Vec_WrdSize(&pPin->vFunc) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                        ,0x15a,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
        }
        pVVar21 = (Vec_Wrd_t *)(puVar45 + 6);
        iVar25 = 1 << ((char)uVar13 - 6U & 0x1f);
        if ((int)uVar13 < 7) {
          iVar25 = 1;
        }
        iVar42 = pVVar21->nCap;
        if (pVVar21->nCap < iVar25) {
          if ((void *)puVar45[7] == (void *)0x0) {
            pvVar19 = malloc((long)iVar25 << 3);
          }
          else {
            pvVar19 = realloc((void *)puVar45[7],(long)iVar25 << 3);
          }
          puVar45[7] = pvVar19;
          if (pvVar19 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          pVVar21->nCap = iVar25;
          iVar42 = iVar25;
        }
        if (0 < iVar42) {
          iVar25 = 0;
          do {
            uVar41 = uVar31 & 0xffffffff;
            lVar43 = 0;
            uVar26 = 0;
            do {
              local_8c = (int)uVar41 + 1;
              uVar29 = local_8c;
              pcVar17 = local_80;
              if (((int)uVar31 < 0) || (local_88->nSize <= (int)uVar41)) goto LAB_0043c9cd;
              uVar26 = uVar26 | (ulong)(byte)local_88->pArray[uVar41] << ((byte)lVar43 & 0x3f);
              uVar41 = uVar41 + 1;
              lVar43 = lVar43 + 8;
            } while (lVar43 != 0x40);
            Vec_WrdPush(pVVar21,uVar26);
            iVar25 = iVar25 + 1;
            uVar31 = uVar41;
          } while (iVar25 < pVVar21->nCap);
        }
      }
      else {
        __ptr = (uint *)malloc(0x10);
        if (uVar13 - 1 < 7) {
          uVar26 = 8;
        }
        __ptr[1] = 0;
        uVar29 = (uint)uVar26;
        *__ptr = uVar29;
        if (uVar29 == 0) {
          pvVar19 = (void *)0x0;
        }
        else {
          pvVar19 = malloc((long)(int)uVar29 << 3);
        }
        puVar45 = local_78;
        *(void **)(__ptr + 2) = pvVar19;
        if (0 < (int)uVar13) {
          uVar41 = 0;
          do {
            if ((long)*(int *)((long)puVar45 + 0x34) <= (long)uVar41) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            uVar8 = **(undefined8 **)(puVar45[7] + uVar41 * 8);
            if (uVar41 == uVar26) {
              if ((int)uVar26 < 0x10) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar19 = malloc(0x80);
                }
                else {
                  pvVar19 = realloc(*(void **)(__ptr + 2),0x80);
                }
                *(void **)(__ptr + 2) = pvVar19;
                *__ptr = 0x10;
                uVar26 = 0x10;
              }
              else {
                uVar13 = (int)uVar26 * 2;
                uVar26 = (ulong)uVar13;
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar19 = malloc(uVar26 * 8);
                }
                else {
                  pvVar19 = realloc(*(void **)(__ptr + 2),uVar26 * 8);
                }
                *(void **)(__ptr + 2) = pvVar19;
                *__ptr = uVar13;
              }
            }
            else {
              pvVar19 = *(void **)(__ptr + 2);
            }
            uVar38 = uVar41 + 1;
            __ptr[1] = (uint)uVar38;
            *(undefined8 *)((long)pvVar19 + uVar41 * 8) = uVar8;
            uVar13 = *(uint *)(puVar45 + 8);
            uVar41 = uVar38;
          } while ((long)uVar38 < (long)(int)uVar13);
        }
        puVar12 = local_50;
        if (*(int *)((long)local_50 + 0x34) != 0) {
          __assert_fail("Vec_WrdSize(&pPin->vFunc) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                        ,0x16a,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
        }
        if ((void *)local_50[7] != (void *)0x0) {
          free((void *)local_50[7]);
          puVar12[7] = 0;
          uVar13 = *(uint *)(puVar45 + 8);
        }
        puVar12[6] = 0;
        ppVarNames = *(char ***)(__ptr + 2);
        pVVar21 = Mio_ParseFormulaTruth((char *)puVar12[5],ppVarNames,uVar13);
        pwVar9 = pVVar21->pArray;
        puVar12[6] = *(undefined8 *)pVVar21;
        puVar12[7] = pwVar9;
        free(pVVar21);
        if (ppVarNames != (char **)0x0) {
          free(ppVarNames);
        }
        free(__ptr);
        uVar13 = *(uint *)((long)local_50 + 0x34);
        uVar29 = 1 << ((char)*(int *)(local_78 + 8) - 6U & 0x1f);
        if (*(int *)(local_78 + 8) < 7) {
          uVar29 = 1;
        }
        if (uVar13 != uVar29) {
          __assert_fail("Vec_WrdSize(&pPin->vFunc) == Abc_Truth6WordNum(pCell->n_inputs)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                        ,0x171,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
        }
        if (0 < (int)uVar13) {
          uVar41 = 0;
          do {
            uVar26 = uVar31 & 0xffffffff;
            lVar43 = 0;
            uVar38 = 0;
            do {
              local_8c = (int)uVar26 + 1;
              uVar29 = local_8c;
              pcVar17 = local_80;
              if (((int)uVar31 < 0) || (local_88->nSize <= (int)uVar26)) goto LAB_0043c9cd;
              uVar38 = uVar38 | (ulong)(byte)local_88->pArray[uVar26] << ((byte)lVar43 & 0x3f);
              uVar26 = uVar26 + 1;
              lVar43 = lVar43 + 8;
            } while (lVar43 != 0x40);
            if (uVar38 != *(ulong *)(local_50[7] + uVar41 * 8)) {
              pcVar39 = "Value == Vec_WrdEntry(&pPin->vFunc, k)";
              pcVar40 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
              ;
              pcVar17 = "int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)";
              goto LAB_0043da47;
            }
            uVar41 = uVar41 + 1;
            uVar31 = uVar26;
          } while (uVar41 != uVar13);
        }
      }
      if (0 < *(int *)(local_78 + 8)) {
        iVar25 = 0;
        do {
          pcVar17 = (char *)calloc(1,0x18);
          puVar45 = local_50;
          uVar13 = *(uint *)((long)local_50 + 0x44);
          if (uVar13 == *(uint *)(local_50 + 8)) {
            if ((int)uVar13 < 0x10) {
              if ((void *)local_50[9] == (void *)0x0) {
                pvVar19 = malloc(0x80);
              }
              else {
                pvVar19 = realloc((void *)local_50[9],0x80);
              }
              puVar45[9] = pvVar19;
              *(undefined4 *)(puVar45 + 8) = 0x10;
            }
            else {
              if ((void *)local_50[9] == (void *)0x0) {
                pvVar19 = malloc((ulong)uVar13 << 4);
              }
              else {
                pvVar19 = realloc((void *)local_50[9],(ulong)uVar13 << 4);
              }
              puVar45[9] = pvVar19;
              *(uint *)(puVar45 + 8) = uVar13 * 2;
            }
          }
          else {
            pvVar19 = (void *)local_50[9];
          }
          iVar42 = *(int *)((long)puVar45 + 0x44);
          *(int *)((long)puVar45 + 0x44) = iVar42 + 1;
          *(char **)((long)pvVar19 + (long)iVar42 * 8) = pcVar17;
          uVar41 = (ulong)local_8c;
          if (((int)local_8c < 0) || (iVar42 = local_88->nSize, iVar42 <= (int)local_8c))
          goto LAB_0043d9dd;
          local_48 = CONCAT44(local_48._4_4_,iVar25);
          pcVar39 = local_88->pArray;
          pcVar40 = pcVar39 + uVar41;
          uVar13 = local_8c + 2;
          uVar29 = local_8c + 4;
          iVar25 = local_8c + 3;
          do {
            uVar28 = local_8c;
            iVar37 = iVar25;
            uVar24 = uVar29;
            uVar35 = uVar13;
            local_8c = uVar28 + 1;
            uVar29 = local_8c;
            if (iVar42 <= (int)uVar28) goto LAB_0043c9cd;
            cVar2 = *pcVar40;
            pcVar40 = pcVar40 + 1;
            uVar13 = uVar35 + 1;
            uVar29 = uVar24 + 1;
            iVar25 = iVar37 + 1;
          } while (cVar2 != '\0');
          local_68 = (Vec_Int_t *)(pcVar39 + uVar41);
          local_80 = pcVar17;
          sVar16 = strlen((char *)local_68);
          local_58 = (char *)malloc(sVar16 + 1);
          strcpy(local_58,(char *)local_68);
          *(char **)local_80 = local_58;
          uVar13 = uVar28 + 2;
          uVar29 = uVar13;
          pcVar17 = local_80;
          if ((int)uVar28 < -1) goto LAB_0043c9cd;
          bVar23 = 0;
          uVar28 = 0;
          local_8c = uVar13;
          while( true ) {
            uVar29 = local_8c;
            if (iVar42 <= (int)(uVar35 - 1)) goto LAB_0043c9cd;
            bVar1 = pcVar39[uVar35 - 1];
            if (-1 < (char)bVar1) break;
            uVar28 = uVar28 | (bVar1 & 0x7f) << (bVar23 & 0x1f);
            uVar35 = uVar35 + 1;
            bVar23 = bVar23 + 7;
            uVar24 = uVar24 + 1;
            iVar37 = iVar37 + 1;
            uVar29 = uVar35;
            local_8c = uVar35;
            if ((int)uVar13 < 0) goto LAB_0043c9cd;
          }
          uVar28 = (uint)bVar1 << (bVar23 & 0x1f) | uVar28;
          if (1 < (int)uVar28) {
            __assert_fail("n <= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                          ,0x180,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
          }
          if (uVar28 == 1) {
            pvVar19 = calloc(1,0x2d8);
            pcVar17 = local_80;
            uVar13 = *(uint *)(local_80 + 0xc);
            if (uVar13 == *(uint *)(local_80 + 8)) {
              if ((int)uVar13 < 0x10) {
                if (*(void **)(local_80 + 0x10) == (void *)0x0) {
                  pvVar22 = malloc(0x80);
                }
                else {
                  pvVar22 = realloc(*(void **)(local_80 + 0x10),0x80);
                }
                *(void **)(pcVar17 + 0x10) = pvVar22;
                pcVar17[8] = '\x10';
                pcVar17[9] = '\0';
                pcVar17[10] = '\0';
                pcVar17[0xb] = '\0';
              }
              else {
                if (*(void **)(local_80 + 0x10) == (void *)0x0) {
                  pvVar22 = malloc((ulong)uVar13 << 4);
                }
                else {
                  pvVar22 = realloc(*(void **)(local_80 + 0x10),(ulong)uVar13 << 4);
                }
                *(void **)(pcVar17 + 0x10) = pvVar22;
                *(uint *)(pcVar17 + 8) = uVar13 * 2;
              }
            }
            else {
              pvVar22 = *(void **)(local_80 + 0x10);
            }
            vOut_00 = local_88;
            iVar25 = *(int *)(pcVar17 + 0xc);
            *(int *)(pcVar17 + 0xc) = iVar25 + 1;
            *(void **)((long)pvVar22 + (long)iVar25 * 8) = pvVar19;
            uVar13 = uVar35 + 1;
            uVar29 = uVar13;
            pcVar17 = local_80;
            if ((int)uVar35 < 0) goto LAB_0043c9cd;
            if ((int)uVar35 < local_88->nSize) {
              uVar35 = local_88->nSize;
            }
            bVar23 = 0;
            uVar28 = 0;
            local_8c = uVar13;
            while( true ) {
              uVar36 = uVar24;
              uVar29 = local_8c;
              if (iVar37 - uVar35 == 1) goto LAB_0043c9cd;
              bVar1 = local_88->pArray[uVar36 - 2];
              if (-1 < (char)bVar1) break;
              uVar28 = uVar28 | (bVar1 & 0x7f) << (bVar23 & 0x1f);
              iVar37 = iVar37 + 1;
              bVar23 = bVar23 + 7;
              uVar24 = uVar36 + 1;
              local_8c = uVar36;
              uVar29 = uVar36;
              if ((int)uVar13 < 0) goto LAB_0043c9cd;
            }
            *(uint *)((long)pvVar19 + 8) = (uint)bVar1 << (bVar23 & 0x1f) | uVar28;
            Abc_SclReadSurface(local_88,(int *)&local_8c,(SC_Surface *)((long)pvVar19 + 0x18));
            Abc_SclReadSurface(vOut_00,(int *)&local_8c,(SC_Surface *)((long)pvVar19 + 200));
            Abc_SclReadSurface(vOut_00,(int *)&local_8c,(SC_Surface *)((long)pvVar19 + 0x178));
            Abc_SclReadSurface(vOut_00,(int *)&local_8c,(SC_Surface *)((long)pvVar19 + 0x228));
          }
          else if (*(int *)(local_80 + 0xc) != 0) {
            __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                          ,0x18d,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
          }
          iVar25 = (uint)local_48 + 1;
        } while (iVar25 < *(int *)(local_78 + 8));
      }
      uVar13 = local_5c + 1;
    } while ((int)uVar13 < *(int *)((long)local_78 + 0x44));
  }
  uVar36 = local_34 - 1;
  uVar13 = local_38;
  if (uVar36 == 0) {
    uVar35 = local_88->nSize;
    uVar13 = local_8c;
LAB_0043d9ad:
    pSVar15 = local_70;
    if (uVar13 == uVar35) {
      Abc_SclHashCells(local_70);
      Abc_SclLinkCells(pSVar15);
      return pSVar15;
    }
    __assert_fail("Pos == Vec_StrSize(vOut)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                  ,0x19b,"SC_Lib *Abc_SclReadFromStr(Vec_Str_t *)");
  }
  goto LAB_0043ca03;
  while (lVar10 = lVar43 + 1, lVar43 = lVar43 + 1, pcVar40[uVar41 + lVar10] != '\0') {
LAB_0043bc65:
    local_8c = (int)lVar43 + iVar25 + 2;
    uVar29 = local_8c;
    local_70 = pSVar15;
    if ((int)uVar13 <= (int)lVar43 + iVar25 + 1) goto LAB_0043c9cd;
  }
  local_88 = vOut;
  sVar16 = strlen(pcVar40 + uVar41 + 1);
  pcVar17 = (char *)malloc(sVar16 + 1);
  strcpy(pcVar17,pcVar40 + uVar41 + 1);
  local_70->pName = pcVar17;
  iVar42 = (int)lVar43;
  if ((-2 < iVar42 + iVar25) && (iVar42 + iVar25 + 1 < (int)uVar13)) {
    uVar38 = (ulong)(iVar42 + iVar25 + 8);
    uVar26 = lVar43 + uVar41 + 1;
    do {
      local_8c = (int)uVar26 + 1;
      iVar25 = (int)uVar38;
      uVar29 = local_8c;
      pcVar17 = local_80;
      if ((int)uVar13 <= iVar25 + -7) goto LAB_0043c9cd;
      uVar38 = (ulong)(iVar25 + 1);
      uVar31 = uVar26 + 1;
      pcVar17 = pcVar40 + uVar26;
      uVar26 = uVar31;
    } while (*pcVar17 != '\0');
    sVar16 = strlen(pcVar40 + lVar43 + uVar41 + 1);
    pcVar17 = (char *)malloc(sVar16 + 1);
    strcpy(pcVar17,pcVar40 + lVar43 + uVar41 + 1);
    local_70->default_wire_load = pcVar17;
    if ((-2 < iVar25 + -7) && ((int)(iVar25 - 6U) < (int)uVar13)) {
      uVar41 = (ulong)(iVar25 - 6U);
      do {
        iVar25 = (int)uVar38;
        local_8c = iVar25 - 6;
        uVar29 = local_8c;
        pcVar17 = local_80;
        if ((int)uVar13 <= iVar25 + -7) goto LAB_0043c9cd;
        uVar38 = (ulong)(iVar25 + 1);
        uVar26 = uVar41 + 1;
        pcVar17 = pcVar40 + uVar41;
        uVar41 = uVar26;
      } while (*pcVar17 != '\0');
      sVar16 = strlen(pcVar40 + (uVar31 & 0xffffffff));
      pcVar17 = (char *)malloc(sVar16 + 1);
      strcpy(pcVar17,pcVar40 + (uVar31 & 0xffffffff));
      local_70->default_wire_load_sel = pcVar17;
      uVar24 = iVar25 - 5;
      uVar29 = uVar24;
      pcVar17 = local_80;
      if (iVar25 - 6U < uVar13) {
        uVar35 = iVar25 - 4;
        uVar29 = uVar35;
        if (uVar24 < uVar13) {
          uVar28 = iVar25 - 3;
          uVar29 = uVar28;
          if (uVar35 < uVar13) {
            uVar29 = iVar25 - 2;
            if (uVar28 < uVar13) {
              local_70->default_max_out_slew =
                   (float)CONCAT13(pcVar40[uVar28],
                                   CONCAT12(pcVar40[uVar35],
                                            CONCAT11(pcVar40[uVar24],
                                                     pcVar40[(uint)uVar26 & 0x7fffffff])));
              bVar23 = 0;
              uVar24 = 0;
              local_8c = iVar25 - 1U;
              while( true ) {
                uVar35 = (uint)uVar38;
                uVar29 = local_8c;
                if ((int)uVar13 <= (int)(uVar35 - 3)) break;
                bVar1 = pcVar40[uVar35 - 3];
                if (-1 < (char)bVar1) {
                  local_70->unit_time = (uint)bVar1 << (bVar23 & 0x1f) | uVar24;
                  uVar24 = uVar35 - 1;
                  uVar29 = uVar24;
                  if ((uVar35 - 2 < uVar13) && (uVar29 = uVar35, uVar24 < uVar13)) {
                    uVar28 = uVar35 + 1;
                    uVar29 = uVar28;
                    if (uVar35 < uVar13) {
                      uVar29 = uVar35 + 2;
                      if (uVar28 < uVar13) {
                        local_70->unit_cap_fst =
                             (float)CONCAT13(pcVar40[uVar28],
                                             CONCAT12(pcVar40[uVar38],
                                                      CONCAT11(pcVar40[uVar24],pcVar40[uVar35 - 2]))
                                            );
                        bVar23 = 0;
                        uVar24 = 0;
                        local_8c = uVar35 + 3;
                        goto LAB_0043bf09;
                      }
                    }
                  }
                  break;
                }
                uVar24 = uVar24 | (bVar1 & 0x7f) << (bVar23 & 0x1f);
                local_8c = uVar35 - 1;
                uVar38 = (ulong)(uVar35 + 1);
                bVar23 = bVar23 + 7;
                uVar29 = local_8c;
                if ((int)(iVar25 - 1U) < 0) break;
              }
            }
          }
        }
      }
      goto LAB_0043c9cd;
    }
  }
LAB_0043d9dd:
  pcVar39 = "i >= 0 && i < p->nSize";
  pcVar40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h";
  pcVar17 = "char *Vec_StrEntryP(Vec_Str_t *, int)";
LAB_0043da47:
  __assert_fail(pcVar39,pcVar40,0x175,pcVar17);
  while( true ) {
    pcVar39 = local_88->pArray;
    pcVar40 = pcVar39 + uVar13;
    local_8c = uVar13;
    uVar24 = uVar13;
    do {
      uVar28 = local_8c;
      uVar24 = uVar24 + 1;
      local_8c = uVar28 + 1;
      uVar29 = local_8c;
      pcVar17 = local_80;
      if (iVar25 <= (int)uVar28) goto LAB_0043c9cd;
      cVar2 = *pcVar40;
      pcVar40 = pcVar40 + 1;
    } while (cVar2 != '\0');
    local_50 = (undefined8 *)CONCAT44(local_50._4_4_,uVar35 + 1);
    sVar16 = strlen(pcVar39 + uVar13);
    pcVar17 = (char *)malloc(sVar16 + 1);
    strcpy(pcVar17,pcVar39 + uVar13);
    *(char **)local_80 = pcVar17;
    uVar13 = uVar28 + 2;
    uVar29 = uVar13;
    pcVar17 = local_80;
    if ((int)uVar28 < -1) goto LAB_0043c9cd;
    bVar23 = 0;
    uVar35 = 0;
    local_8c = uVar13;
    while( true ) {
      uVar29 = local_8c;
      if (iVar25 <= (int)uVar24) goto LAB_0043c9cd;
      bVar1 = pcVar39[uVar24];
      if (-1 < (char)bVar1) break;
      uVar35 = uVar35 | (bVar1 & 0x7f) << (bVar23 & 0x1f);
      local_8c = uVar24 + 2;
      uVar24 = uVar24 + 1;
      bVar23 = bVar23 + 7;
      uVar29 = local_8c;
      if ((int)uVar13 < 0) goto LAB_0043c9cd;
    }
    uVar13 = uVar24 + 1;
    uVar35 = (uint)bVar1 << (bVar23 & 0x1f) | uVar35;
    while (uVar35 != 0) {
      uVar24 = uVar13 + 1;
      uVar29 = uVar24;
      pcVar17 = local_80;
      if (((int)uVar13 < 0) || (uVar28 = local_88->nSize, (int)uVar28 <= (int)uVar13))
      goto LAB_0043c9cd;
      pcVar40 = local_88->pArray;
      uVar41 = (ulong)uVar13;
      uVar36 = (uint)(byte)pcVar40[uVar41];
      uVar32 = (uint)(uVar41 + 2);
      uVar29 = uVar32;
      if (uVar28 <= uVar24) goto LAB_0043c9cd;
      bVar23 = pcVar40[uVar24];
      uVar24 = (uint)(uVar41 + 3);
      uVar29 = uVar24;
      if (uVar28 <= uVar32) goto LAB_0043c9cd;
      uVar26 = (ulong)local_68 >> 0x20;
      local_68 = (Vec_Int_t *)CONCAT44((int)uVar26,uVar35);
      bVar1 = pcVar40[uVar41 + 2];
      lVar43 = uVar41 + 4;
      local_8c = (uint)lVar43;
      uVar29 = local_8c;
      if (uVar28 <= uVar24) goto LAB_0043c9cd;
      bVar3 = pcVar40[uVar41 + 3];
      uVar29 = *(uint *)(local_80 + 0xc);
      if (uVar29 == *(uint *)(local_80 + 8)) {
        uVar26 = (ulong)local_58 >> 0x20;
        local_58 = (char *)CONCAT44((int)uVar26,(uint)(byte)pcVar40[uVar41]);
        if ((int)uVar29 < 0x10) {
          if (*(void **)(local_80 + 0x10) == (void *)0x0) {
            pvVar19 = malloc(0x40);
          }
          else {
            pvVar19 = realloc(*(void **)(local_80 + 0x10),0x40);
          }
          *(void **)(local_80 + 0x10) = pvVar19;
          local_80[8] = '\x10';
          local_80[9] = '\0';
          local_80[10] = '\0';
          local_80[0xb] = '\0';
        }
        else {
          local_48 = lVar43;
          if (*(void **)(local_80 + 0x10) == (void *)0x0) {
            pvVar19 = malloc((ulong)uVar29 * 8);
          }
          else {
            pvVar19 = realloc(*(void **)(local_80 + 0x10),(ulong)uVar29 * 8);
          }
          *(void **)(local_80 + 0x10) = pvVar19;
          *(uint *)(local_80 + 8) = uVar29 * 2;
          lVar43 = local_48;
        }
        uVar36 = (uint)local_58;
      }
      else {
        pvVar19 = *(void **)(local_80 + 0x10);
      }
      iVar25 = *(int *)(local_80 + 0xc);
      *(int *)(local_80 + 0xc) = iVar25 + 1;
      *(uint *)((long)pvVar19 + (long)iVar25 * 4) =
           (uint)bVar3 << 0x18 | (uint)bVar1 << 0x10 | (uint)bVar23 << 8 | uVar36;
      uVar35 = (uint)(uVar41 + 5);
      uVar24 = local_88->nSize;
      uVar29 = uVar35;
      pcVar17 = local_80;
      if ((int)uVar24 <= (int)lVar43) goto LAB_0043c9cd;
      pcVar40 = local_88->pArray;
      cVar2 = pcVar40[lVar43];
      uVar28 = (uint)(uVar41 + 6);
      uVar29 = uVar28;
      if (uVar24 <= uVar35) goto LAB_0043c9cd;
      cVar4 = pcVar40[uVar41 + 5];
      uVar35 = (uint)(uVar41 + 7);
      uVar29 = uVar35;
      if (uVar24 <= uVar28) goto LAB_0043c9cd;
      cVar5 = pcVar40[uVar41 + 6];
      uVar28 = uVar13 + 8;
      uVar29 = uVar28;
      if (uVar24 <= uVar35) goto LAB_0043c9cd;
      cVar6 = pcVar40[uVar41 + 7];
      uVar13 = *(uint *)(local_80 + 0x1c);
      local_8c = uVar28;
      if (uVar13 == *(uint *)(local_80 + 0x18)) {
        if ((int)uVar13 < 0x10) {
          if (*(void **)(local_80 + 0x20) == (void *)0x0) {
            pvVar19 = malloc(0x40);
          }
          else {
            pvVar19 = realloc(*(void **)(local_80 + 0x20),0x40);
          }
          *(void **)(local_80 + 0x20) = pvVar19;
          local_80[0x18] = '\x10';
          local_80[0x19] = '\0';
          local_80[0x1a] = '\0';
          local_80[0x1b] = '\0';
        }
        else {
          if (*(void **)(local_80 + 0x20) == (void *)0x0) {
            pvVar19 = malloc((ulong)uVar13 * 8);
          }
          else {
            pvVar19 = realloc(*(void **)(local_80 + 0x20),(ulong)uVar13 * 8);
          }
          *(void **)(local_80 + 0x20) = pvVar19;
          *(uint *)(local_80 + 0x18) = uVar13 * 2;
        }
      }
      else {
        pvVar19 = *(void **)(local_80 + 0x20);
      }
      iVar25 = *(int *)(local_80 + 0x1c);
      *(int *)(local_80 + 0x1c) = iVar25 + 1;
      *(uint *)((long)pvVar19 + (long)iVar25 * 4) =
           CONCAT13(cVar6,CONCAT12(cVar5,CONCAT11(cVar4,cVar2)));
      if (local_88->nSize <= (int)uVar28) goto LAB_0043d9dd;
      pcVar40 = local_88->pArray + uVar28;
      uVar24 = uVar28;
      do {
        uVar13 = uVar24 + 1;
        uVar29 = uVar13;
        pcVar17 = local_80;
        if (local_88->nSize <= (int)uVar24) goto LAB_0043c9cd;
        cVar2 = *pcVar40;
        pcVar40 = pcVar40 + 1;
        uVar24 = uVar13;
      } while (cVar2 != '\0');
      pcVar40 = local_88->pArray + uVar28;
      local_8c = uVar13;
      sVar16 = strlen(pcVar40);
      pcVar17 = (char *)malloc(sVar16 + 1);
      strcpy(pcVar17,pcVar40);
      uVar29 = *(uint *)(local_80 + 0x2c);
      iVar25 = (int)local_68;
      if (uVar29 == *(uint *)(local_80 + 0x28)) {
        if ((int)uVar29 < 0x10) {
          if (*(void **)(local_80 + 0x30) == (void *)0x0) {
            pvVar19 = malloc(0x80);
          }
          else {
            pvVar19 = realloc(*(void **)(local_80 + 0x30),0x80);
          }
          *(void **)(local_80 + 0x30) = pvVar19;
          local_80[0x28] = '\x10';
          local_80[0x29] = '\0';
          local_80[0x2a] = '\0';
          local_80[0x2b] = '\0';
        }
        else {
          if (*(void **)(local_80 + 0x30) == (void *)0x0) {
            pvVar19 = malloc((ulong)uVar29 << 4);
          }
          else {
            pvVar19 = realloc(*(void **)(local_80 + 0x30),(ulong)uVar29 << 4);
          }
          *(void **)(local_80 + 0x30) = pvVar19;
          *(uint *)(local_80 + 0x28) = uVar29 * 2;
        }
      }
      else {
        pvVar19 = *(void **)(local_80 + 0x30);
      }
      iVar42 = *(int *)(local_80 + 0x2c);
      *(int *)(local_80 + 0x2c) = iVar42 + 1;
      *(char **)((long)pvVar19 + (long)iVar42 * 8) = pcVar17;
      uVar35 = iVar25 - 1;
    }
    local_5c = local_5c - 1;
    uVar35 = (uint)local_50;
    if (local_5c == 0) break;
LAB_0043c4bb:
    local_80 = (char *)calloc(1,0x38);
    uVar29 = (uint)local_78;
    if (uVar35 == uVar29) {
      if ((int)uVar29 < 0x10) {
        ppvVar18 = (local_70->vWireLoadSels).pArray;
        if (ppvVar18 == (void **)0x0) {
          ppvVar18 = (void **)malloc(0x80);
        }
        else {
          ppvVar18 = (void **)realloc(ppvVar18,0x80);
        }
        (local_70->vWireLoadSels).pArray = ppvVar18;
        (local_70->vWireLoadSels).nCap = 0x10;
        puVar45 = (undefined8 *)&DAT_00000010;
      }
      else {
        puVar45 = (undefined8 *)(ulong)(uVar29 * 2);
        ppvVar18 = (local_70->vWireLoadSels).pArray;
        if (ppvVar18 == (void **)0x0) {
          ppvVar18 = (void **)malloc((long)puVar45 * 8);
        }
        else {
          ppvVar18 = (void **)realloc(ppvVar18,(long)puVar45 * 8);
        }
        (local_70->vWireLoadSels).pArray = ppvVar18;
        (local_70->vWireLoadSels).nCap = uVar29 * 2;
      }
    }
    else {
      ppvVar18 = (local_70->vWireLoadSels).pArray;
      puVar45 = local_78;
    }
    (local_70->vWireLoadSels).nSize = uVar35 + 1;
    ppvVar18[uVar35] = local_80;
    local_78 = puVar45;
    if (((int)uVar13 < 0) || (iVar25 = local_88->nSize, iVar25 <= (int)uVar13)) goto LAB_0043d9dd;
  }
LAB_0043c97c:
  uVar24 = uVar13 + 1;
  uVar29 = uVar24;
  pcVar17 = local_80;
  if (-1 < (int)uVar13) {
    uVar35 = local_88->nSize;
    uVar28 = uVar35;
    if ((int)uVar35 < (int)uVar13) {
      uVar28 = uVar13;
    }
    bVar23 = 0;
    uVar36 = 0;
    local_8c = uVar24;
    do {
      uVar29 = local_8c;
      if (uVar28 == uVar13) break;
      bVar1 = local_88->pArray[uVar13];
      if (-1 < (char)bVar1) {
        uVar36 = (uint)bVar1 << (bVar23 & 0x1f) | uVar36;
        if (uVar36 == 0) {
          uVar13 = uVar13 + 1;
          goto LAB_0043d9ad;
        }
        local_40 = 0;
        uVar13 = 0;
        goto LAB_0043ca03;
      }
      uVar36 = uVar36 | (bVar1 & 0x7f) << (bVar23 & 0x1f);
      local_8c = uVar13 + 2;
      uVar13 = uVar13 + 1;
      bVar23 = bVar23 + 7;
      uVar29 = local_8c;
    } while (-1 < (int)uVar24);
  }
LAB_0043c9cd:
  local_80 = pcVar17;
  local_8c = uVar29;
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

SC_Lib * Abc_SclReadFromStr( Vec_Str_t * vOut )
{
    SC_Lib * p;
    int Pos = 0;
    // read the library
    p = Abc_SclLibAlloc();
    if ( !Abc_SclReadLibrary( vOut, &Pos, p ) )
        return NULL;
    assert( Pos == Vec_StrSize(vOut) );
    // hash gates by name
    Abc_SclHashCells( p );
    Abc_SclLinkCells( p );
    return p;
}